

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP3Serializer.cpp
# Opt level: O1

void __thiscall adios2::format::BP3Serializer::SerializeDataBuffer(BP3Serializer *this)

{
  IO *in_RSI;
  
  SerializeDataBuffer((BP3Serializer *)&this[-1].field_0x4d8,in_RSI);
  return;
}

Assistant:

void BP3Serializer::SerializeDataBuffer(core::IO &io) noexcept
{
    auto &buffer = m_Data.m_Buffer;
    auto &position = m_Data.m_Position;
    auto &absolutePosition = m_Data.m_AbsolutePosition;

    // vars count and Length (only for PG)
    helper::CopyToBuffer(buffer, m_MetadataSet.DataPGVarsCountPosition,
                         &m_MetadataSet.DataPGVarsCount);
    // without record itself and vars count
    const uint64_t varsLength = position - m_MetadataSet.DataPGVarsCountPosition - 8 - 4;
    helper::CopyToBuffer(buffer, m_MetadataSet.DataPGVarsCountPosition, &varsLength);

    // each attribute is only written to output once
    size_t attributesSizeInData = GetAttributesSizeInData(io);
    if (attributesSizeInData)
    {
        attributesSizeInData += 12; // count + length
        m_Data.Resize(position + attributesSizeInData, "when writing Attributes in rank=0\n");

        PutAttributes(io);
    }
    else
    {
        m_Data.Resize(position + 12, "for empty Attributes\n");
        // Attribute index header for zero attributes: 0, 0LL
        // Resize() already takes care of this
        position += 12;
        absolutePosition += 12;
    }

    // Finish writing pg group length without record itself
    const uint64_t dataPGLength = position - m_MetadataSet.DataPGLengthPosition - 8;
    helper::CopyToBuffer(buffer, m_MetadataSet.DataPGLengthPosition, &dataPGLength);

    m_MetadataSet.DataPGIsOpen = false;
}